

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O3

void __thiscall
lf::assemble::UniformFEDofHandler::UniformFEDofHandler
          (UniformFEDofHandler *this,shared_ptr<const_lf::mesh::Mesh> *mesh,dof_map_t *dofmap,
          bool check_edge_orientation)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  dof_map_t *pdVar6;
  dof_map_t *pdVar7;
  dof_map_t *pdVar8;
  dof_map_t *pdVar9;
  dof_map_t *pdVar10;
  stringstream ss;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  (this->super_DofHandler)._vptr_DofHandler = (_func_int **)&PTR__UniformFEDofHandler_0036f5f8;
  this->kNodeOrd = 2;
  this->kEdgeOrd = 1;
  this->kCellOrd = 0;
  (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3
  ;
  (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var4;
  (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  this->num_dof_ = 0;
  memset(&this->dof_entities_,0,0x84);
  this->check_edge_orientation_ = check_edge_orientation;
  iVar5 = (**((this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_vptr_Mesh)();
  if (iVar5 != 2) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Can handle 2D meshes only",0x19);
    paVar1 = &local_1f8.field_2;
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,"(mesh_->DimMesh() == 2)","");
    paVar2 = &local_218.field_2;
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_1f8,&local_218,0x5c,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"false","");
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
               ,"");
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
    base::AssertionFailed(&local_1f8,&local_218,0x5c,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    abort();
  }
  pdVar6 = *(dof_map_t **)(dofmap + 0x10);
  if (pdVar6 != (dof_map_t *)0x0) {
    pdVar10 = dofmap + 8;
    pdVar7 = pdVar10;
    pdVar8 = pdVar6;
    do {
      if (pdVar8[0x20] != (dof_map_t)0x0) {
        pdVar7 = pdVar8;
      }
      pdVar8 = *(dof_map_t **)(pdVar8 + (ulong)(pdVar8[0x20] == (dof_map_t)0x0) * 8 + 0x10);
    } while (pdVar8 != (dof_map_t *)0x0);
    pdVar8 = pdVar10;
    pdVar9 = pdVar6;
    if ((pdVar7 != pdVar10) && ((byte)pdVar7[0x20] < 2)) {
      this->num_loc_dof_point_ = *(size_type *)(pdVar7 + 0x24);
    }
    do {
      if ((byte)pdVar9[0x20] >= 2) {
        pdVar8 = pdVar9;
      }
      pdVar7 = pdVar9 + (ulong)((byte)pdVar9[0x20] < 2) * 8 + 0x10;
      pdVar9 = *(dof_map_t **)pdVar7;
    } while (*(dof_map_t **)pdVar7 != (dof_map_t *)0x0);
    pdVar7 = pdVar10;
    pdVar9 = pdVar6;
    if ((pdVar8 != pdVar10) && ((byte)pdVar8[0x20] < 3)) {
      this->num_loc_dof_segment_ = *(size_type *)(pdVar8 + 0x24);
    }
    do {
      if ((byte)pdVar9[0x20] >= 3) {
        pdVar7 = pdVar9;
      }
      pdVar8 = pdVar9 + (ulong)((byte)pdVar9[0x20] < 3) * 8 + 0x10;
      pdVar9 = *(dof_map_t **)pdVar8;
    } while (*(dof_map_t **)pdVar8 != (dof_map_t *)0x0);
    pdVar8 = pdVar10;
    if ((pdVar7 != pdVar10) && ((byte)pdVar7[0x20] < 4)) {
      this->num_loc_dof_tria_ = *(size_type *)(pdVar7 + 0x24);
    }
    do {
      if ((byte)pdVar6[0x20] >= 4) {
        pdVar8 = pdVar6;
      }
      pdVar6 = *(dof_map_t **)(pdVar6 + (ulong)((byte)pdVar6[0x20] < 4) * 8 + 0x10);
    } while (pdVar6 != (dof_map_t *)0x0);
    if ((pdVar8 != pdVar10) && ((byte)pdVar8[0x20] < 5)) {
      this->num_loc_dof_quad_ = *(size_type *)(pdVar8 + 0x24);
    }
  }
  InitTotalNumDofs(this);
  initIndexArrays(this);
  return;
}

Assistant:

UniformFEDofHandler::UniformFEDofHandler(
    std::shared_ptr<const lf::mesh::Mesh> mesh, dof_map_t dofmap,
    bool check_edge_orientation)
    : mesh_(std::move(mesh)),
      num_dofs_(),
      check_edge_orientation_(check_edge_orientation) {
  LF_ASSERT_MSG((mesh_->DimMesh() == 2), "Can handle 2D meshes only");

  // For checking whether a key was found
  auto map_end = dofmap.end();

  // Get no of interior dof specified for nodes
  auto map_el_pt = dofmap.find(lf::base::RefEl::kPoint());
  if (map_el_pt != map_end) {
    num_loc_dof_point_ = map_el_pt->second;
  }

  // Get no of interior dof specified for edges
  auto map_el_ed = dofmap.find(lf::base::RefEl::kSegment());
  if (map_el_ed != map_end) {
    num_loc_dof_segment_ = map_el_ed->second;
  }

  // Get no of interior dof specified for triangles
  auto map_el_tr = dofmap.find(lf::base::RefEl::kTria());
  if (map_el_tr != map_end) {
    num_loc_dof_tria_ = map_el_tr->second;
  }

  // Get no of interior dof specified for quads
  auto map_el_qd = dofmap.find(lf::base::RefEl::kQuad());
  if (map_el_qd != map_end) {
    num_loc_dof_quad_ = map_el_qd->second;
  }

  // If an entity type is not represented in the map, we assume that
  // no shape functions are attached to those entities

  // Initialize total number of shape functions covering an entity.
  InitTotalNumDofs();

  // Initializatin of dof index arrays
  initIndexArrays();
}